

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore>::commDisconnect
          (CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore> *this)

{
  memory_order mVar1;
  memory_order *pmVar2;
  long in_RDI;
  int exp;
  memory_order in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff08;
  memory_order in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff50;
  memory_order in_stack_ffffffffffffff54;
  memory_order local_4c [3];
  undefined4 local_40;
  undefined4 local_3c;
  memory_order *local_38;
  memory_order *local_30;
  bool local_21;
  undefined4 local_20;
  memory_order local_1c;
  undefined4 local_18;
  undefined4 local_14;
  memory_order *local_10;
  memory_order *local_8;
  
  local_4c[0] = relaxed;
  pmVar2 = (memory_order *)(in_RDI + 0xd84);
  local_3c = 1;
  local_40 = 5;
  local_38 = local_4c;
  local_30 = pmVar2;
  local_1c = std::__cmpexch_failure_order(in_stack_ffffffffffffff04);
  local_14 = 1;
  local_18 = 5;
  local_20 = 1;
  switch(0x4eae5f) {
  default:
    if (local_1c - consume < 2) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else if (local_1c == seq_cst) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else {
      LOCK();
      in_stack_ffffffffffffff54 = *pmVar2;
      local_21 = local_4c[0] == in_stack_ffffffffffffff54;
      if (local_21) {
        *pmVar2 = consume;
        in_stack_ffffffffffffff54 = local_4c[0];
      }
      UNLOCK();
      in_stack_ffffffffffffff50 = CONCAT13(local_21,(int3)in_stack_ffffffffffffff50);
      if (!local_21) {
        local_4c[0] = in_stack_ffffffffffffff54;
      }
    }
    break;
  case 2:
    if (local_1c - consume < 2) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else if (local_1c == seq_cst) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    break;
  case 3:
    if (local_1c - consume < 2) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else if (local_1c == seq_cst) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    break;
  case 4:
    if (local_1c - consume < 2) {
      LOCK();
      in_stack_ffffffffffffff04 = *pmVar2;
      local_21 = local_4c[0] == in_stack_ffffffffffffff04;
      if (local_21) {
        *pmVar2 = consume;
        in_stack_ffffffffffffff04 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = in_stack_ffffffffffffff04;
      }
    }
    else if (local_1c == seq_cst) {
      LOCK();
      mVar1 = *pmVar2;
      local_21 = local_4c[0] == mVar1;
      if (local_21) {
        *pmVar2 = consume;
        mVar1 = local_4c[0];
      }
      UNLOCK();
      if (!local_21) {
        local_4c[0] = mVar1;
      }
    }
    else {
      LOCK();
      in_stack_ffffffffffffff0c = *pmVar2;
      local_21 = local_4c[0] == in_stack_ffffffffffffff0c;
      if (local_21) {
        *pmVar2 = consume;
        in_stack_ffffffffffffff0c = local_4c[0];
      }
      UNLOCK();
      in_stack_ffffffffffffff08 = CONCAT13(local_21,(int3)in_stack_ffffffffffffff08);
      if (!local_21) {
        local_4c[0] = in_stack_ffffffffffffff0c;
      }
    }
  }
  if (local_21 != false) {
    local_10 = local_4c;
    local_8 = pmVar2;
    CLI::std::
    unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>::
    operator->((unique_ptr<helics::zeromq::ZmqCommsSS,_std::default_delete<helics::zeromq::ZmqCommsSS>_>
                *)0x4eb33c);
    CommsInterface::disconnect
              ((CommsInterface *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    std::__atomic_base<int>::operator=
              ((__atomic_base<int> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff04);
  }
  return;
}

Assistant:

void CommsBroker<COMMS, BrokerT>::commDisconnect()
{
    int exp = 0;
    if (disconnectionStage.compare_exchange_strong(exp, 1)) {
        comms->disconnect();
        disconnectionStage = 2;
    }
}